

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int ReadHuffmanCodesHelper
              (int color_cache_bits,int num_htree_groups,int num_htree_groups_max,int *mapping,
              VP8LDecoder *dec,HuffmanTables *huffman_tables,HTreeGroup **htree_groups)

{
  HuffmanCode **ppHVar1;
  ushort uVar2;
  HuffmanCode HVar3;
  HTreeGroup *pHVar4;
  HuffmanCode *pHVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *code_lengths;
  HTreeGroup *pHVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int local_78;
  
  iVar7 = 1 << ((byte)color_cache_bits & 0x1f);
  iVar8 = 0;
  bVar6 = true;
  if ((num_htree_groups_max < num_htree_groups) ||
     (num_htree_groups != num_htree_groups_max && mapping == (int *)0x0)) {
    code_lengths = (int *)0x0;
  }
  else {
    uVar2 = kTableSize[color_cache_bits];
    iVar14 = iVar7 + 0x118;
    if (color_cache_bits < 1) {
      iVar14 = 0x118;
    }
    code_lengths = (int *)WebPSafeCalloc((long)iVar14,4);
    pHVar11 = VP8LHtreeGroupsNew(num_htree_groups);
    *htree_groups = pHVar11;
    if (((pHVar11 == (HTreeGroup *)0x0) || (code_lengths == (int *)0x0)) ||
       (iVar14 = VP8LHuffmanTablesAllocate((uint)uVar2 * num_htree_groups,huffman_tables),
       iVar14 == 0)) {
      bVar6 = true;
      if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
        dec->status = VP8_STATUS_OUT_OF_MEMORY;
      }
    }
    else {
      uVar12 = 0;
      uVar16 = (ulong)(uint)num_htree_groups_max;
      if (num_htree_groups_max < 1) {
        uVar16 = 0;
      }
      for (; uVar12 != uVar16; uVar12 = uVar12 + 1) {
        bVar6 = true;
        if (mapping == (int *)0x0) {
          iVar8 = (int)uVar12;
LAB_0010ac84:
          pHVar4 = *htree_groups;
          pHVar11 = pHVar4 + iVar8;
          iVar14 = 0;
          uVar15 = 1;
          local_78 = 0;
          for (uVar19 = 0; uVar19 != 5; uVar19 = uVar19 + 1) {
            iVar9 = 0;
            if (uVar19 == 0) {
              iVar9 = iVar7;
            }
            uVar2 = kAlphabetSize[uVar19];
            if (color_cache_bits < 1) {
              iVar9 = 0;
            }
            iVar10 = ReadHuffmanCode((int)((long)iVar9 + (ulong)uVar2),dec,code_lengths,
                                     huffman_tables);
            pHVar5 = huffman_tables->curr_segment->curr_table;
            pHVar11->htrees[uVar19] = pHVar5;
            if (iVar10 == 0) {
              bVar6 = true;
              iVar8 = 0;
              goto LAB_0010af3f;
            }
            if (uVar15 == 0) {
              bVar13 = pHVar5->bits;
              uVar15 = 0;
            }
            else {
              bVar13 = pHVar5->bits;
              if ((uVar19 & 3) == 0) {
                uVar15 = 1;
              }
              else {
                uVar15 = (uint)(bVar13 == 0);
              }
            }
            ppHVar1 = &huffman_tables->curr_segment->curr_table;
            *ppHVar1 = *ppHVar1 + iVar10;
            if (uVar19 != 4) {
              iVar10 = *code_lengths;
              for (lVar17 = 1; lVar17 < (long)((long)iVar9 + (ulong)uVar2); lVar17 = lVar17 + 1) {
                if (iVar10 < code_lengths[lVar17]) {
                  iVar10 = code_lengths[lVar17];
                }
              }
              local_78 = local_78 + iVar10;
            }
            iVar14 = iVar14 + (uint)bVar13;
          }
          pHVar11->is_trivial_literal = uVar15;
          pHVar11->is_trivial_code = 0;
          bVar13 = 1;
          if (uVar15 != 0) {
            uVar15 = CONCAT22(pHVar11->htrees[1]->value,pHVar11->htrees[2]->value) |
                     (uint)pHVar11->htrees[3]->value << 0x18;
            pHVar11->literal_arb = uVar15;
            if ((iVar14 == 0) && (uVar2 = pHVar11->htrees[0]->value, uVar2 < 0x100)) {
              pHVar11->is_trivial_code = 1;
              pHVar11->literal_arb = uVar15 | (uint)uVar2 << 8;
              bVar13 = 0;
            }
          }
          bVar13 = local_78 < 6 & bVar13;
          pHVar11->use_packed_table = (uint)bVar13;
          if (bVar13 == 1) {
            pHVar5 = pHVar11->htrees[0];
            for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 1) {
              bVar13 = pHVar5[lVar17].bits;
              uVar2 = pHVar5[lVar17].value;
              if (uVar2 < 0x100) {
                pHVar4[iVar8].packed_table[lVar17].bits = (uint)bVar13;
                uVar15 = (uint)lVar17 >> (bVar13 & 0x1f);
                pHVar4[iVar8].packed_table[lVar17].value = (uint)uVar2 << 8;
                HVar3 = pHVar11->htrees[1][uVar15];
                iVar14 = ((uint)HVar3 & 0xff) + (uint)bVar13;
                pHVar4[iVar8].packed_table[lVar17].bits = iVar14;
                uVar18 = (uint)HVar3 & 0xffff0000 | (uint)uVar2 << 8;
                pHVar4[iVar8].packed_table[lVar17].value = uVar18;
                uVar15 = uVar15 >> (HVar3.bits & 0x1f);
                HVar3 = pHVar11->htrees[2][uVar15];
                iVar14 = ((uint)HVar3 & 0xff) + iVar14;
                pHVar4[iVar8].packed_table[lVar17].bits = iVar14;
                uVar18 = (uint)HVar3 >> 0x10 | uVar18;
                pHVar4[iVar8].packed_table[lVar17].value = uVar18;
                HVar3 = pHVar11->htrees[3][uVar15 >> (HVar3.bits & 0x1f)];
                pHVar4[iVar8].packed_table[lVar17].bits = ((uint)HVar3 & 0xff) + iVar14;
                pHVar4[iVar8].packed_table[lVar17].value = ((uint)HVar3 & 0xff0000) << 8 | uVar18;
              }
              else {
                pHVar4[iVar8].packed_table[lVar17].bits = bVar13 | 0x100;
                pHVar4[iVar8].packed_table[lVar17].value = (uint)uVar2;
              }
            }
          }
        }
        else {
          iVar8 = mapping[uVar12];
          if (iVar8 != -1) goto LAB_0010ac84;
          lVar17 = 0;
          while (lVar17 != 10) {
            iVar8 = 0;
            iVar14 = 0;
            if (lVar17 == 0) {
              iVar14 = iVar7;
            }
            if (color_cache_bits < 1) {
              iVar14 = 0;
            }
            iVar14 = ReadHuffmanCode(iVar14 + (uint)*(ushort *)((long)kAlphabetSize + lVar17),dec,
                                     code_lengths,(HuffmanTables *)0x0);
            lVar17 = lVar17 + 2;
            if (iVar14 == 0) goto LAB_0010af3f;
          }
        }
      }
      bVar6 = false;
      iVar8 = 1;
    }
  }
LAB_0010af3f:
  WebPSafeFree(code_lengths);
  if (bVar6) {
    VP8LHuffmanTablesDeallocate(huffman_tables);
    VP8LHtreeGroupsFree(*htree_groups);
    *htree_groups = (HTreeGroup *)0x0;
  }
  return iVar8;
}

Assistant:

int ReadHuffmanCodesHelper(int color_cache_bits, int num_htree_groups,
                           int num_htree_groups_max, const int* const mapping,
                           VP8LDecoder* const dec,
                           HuffmanTables* const huffman_tables,
                           HTreeGroup** const htree_groups) {
  int i, j, ok = 0;
  const int max_alphabet_size =
      kAlphabetSize[0] + ((color_cache_bits > 0) ? 1 << color_cache_bits : 0);
  const int table_size = kTableSize[color_cache_bits];
  int* code_lengths = NULL;

  if ((mapping == NULL && num_htree_groups != num_htree_groups_max) ||
      num_htree_groups > num_htree_groups_max) {
    goto Error;
  }

  code_lengths =
      (int*)WebPSafeCalloc((uint64_t)max_alphabet_size, sizeof(*code_lengths));
  *htree_groups = VP8LHtreeGroupsNew(num_htree_groups);

  if (*htree_groups == NULL || code_lengths == NULL ||
      !VP8LHuffmanTablesAllocate(num_htree_groups * table_size,
                                 huffman_tables)) {
    VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
    goto Error;
  }

  for (i = 0; i < num_htree_groups_max; ++i) {
    // If the index "i" is unused in the Huffman image, just make sure the
    // coefficients are valid but do not store them.
    if (mapping != NULL && mapping[i] == -1) {
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        // Passing in NULL so that nothing gets filled.
        if (!ReadHuffmanCode(alphabet_size, dec, code_lengths, NULL)) {
          goto Error;
        }
      }
    } else {
      HTreeGroup* const htree_group =
          &(*htree_groups)[(mapping == NULL) ? i : mapping[i]];
      HuffmanCode** const htrees = htree_group->htrees;
      int size;
      int total_size = 0;
      int is_trivial_literal = 1;
      int max_bits = 0;
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        size =
            ReadHuffmanCode(alphabet_size, dec, code_lengths, huffman_tables);
        htrees[j] = huffman_tables->curr_segment->curr_table;
        if (size == 0) {
          goto Error;
        }
        if (is_trivial_literal && kLiteralMap[j] == 1) {
          is_trivial_literal = (htrees[j]->bits == 0);
        }
        total_size += htrees[j]->bits;
        huffman_tables->curr_segment->curr_table += size;
        if (j <= ALPHA) {
          int local_max_bits = code_lengths[0];
          int k;
          for (k = 1; k < alphabet_size; ++k) {
            if (code_lengths[k] > local_max_bits) {
              local_max_bits = code_lengths[k];
            }
          }
          max_bits += local_max_bits;
        }
      }
      htree_group->is_trivial_literal = is_trivial_literal;
      htree_group->is_trivial_code = 0;
      if (is_trivial_literal) {
        const int red = htrees[RED][0].value;
        const int blue = htrees[BLUE][0].value;
        const int alpha = htrees[ALPHA][0].value;
        htree_group->literal_arb = ((uint32_t)alpha << 24) | (red << 16) | blue;
        if (total_size == 0 && htrees[GREEN][0].value < NUM_LITERAL_CODES) {
          htree_group->is_trivial_code = 1;
          htree_group->literal_arb |= htrees[GREEN][0].value << 8;
        }
      }
      htree_group->use_packed_table =
          !htree_group->is_trivial_code && (max_bits < HUFFMAN_PACKED_BITS);
      if (htree_group->use_packed_table) BuildPackedTable(htree_group);
    }
  }
  ok = 1;

 Error:
  WebPSafeFree(code_lengths);
  if (!ok) {
    VP8LHuffmanTablesDeallocate(huffman_tables);
    VP8LHtreeGroupsFree(*htree_groups);
    *htree_groups = NULL;
  }
  return ok;
}